

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Chapters::ExpandEditionsArray(Chapters *this)

{
  int iVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  Edition *pEVar7;
  bool bVar8;
  long lVar9;
  
  iVar1 = this->m_editions_size;
  bVar8 = true;
  if (iVar1 <= this->m_editions_count) {
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    lVar5 = (long)iVar6 * 0x10;
    uVar3 = 0xffffffffffffffff;
    if (-1 < iVar6) {
      uVar3 = lVar5 + 8;
    }
    plVar2 = (long *)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    if (plVar2 == (long *)0x0) {
      bVar8 = false;
    }
    else {
      *plVar2 = (long)iVar6;
      lVar9 = 0;
      pEVar7 = (Edition *)(plVar2 + 1);
      do {
        Edition::Edition(pEVar7);
        lVar9 = lVar9 + -0x10;
        pEVar7 = pEVar7 + 1;
      } while (-lVar9 != lVar5);
      pEVar7 = this->m_editions;
      uVar4 = 0;
      uVar3 = (ulong)(uint)this->m_editions_count;
      if (this->m_editions_count < 1) {
        uVar3 = uVar4;
      }
      bVar8 = true;
      for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
        *(undefined8 *)((long)plVar2 + uVar4 + 8) = *(undefined8 *)((long)&pEVar7->m_atoms + uVar4);
        *(undefined8 *)((long)plVar2 + uVar4 + 0x10) =
             *(undefined8 *)((long)&pEVar7->m_atoms_size + uVar4);
      }
      if (pEVar7 != (Edition *)0x0) {
        lVar5._0_4_ = pEVar7[-1].m_atoms_size;
        lVar5._4_4_ = pEVar7[-1].m_atoms_count;
        if (lVar5 != 0) {
          lVar5 = lVar5 << 4;
          do {
            Edition::~Edition((Edition *)((long)&pEVar7[-1].m_atoms + lVar5));
            lVar5 = lVar5 + -0x10;
          } while (lVar5 != 0);
        }
        operator_delete__(&pEVar7[-1].m_atoms_size);
      }
      this->m_editions = (Edition *)(plVar2 + 1);
      this->m_editions_size = iVar6;
    }
  }
  return bVar8;
}

Assistant:

bool Chapters::ExpandEditionsArray() {
  if (m_editions_size > m_editions_count)
    return true;  // nothing else to do

  const int size = (m_editions_size == 0) ? 1 : 2 * m_editions_size;

  Edition* const editions = new (std::nothrow) Edition[size];

  if (editions == NULL)
    return false;

  for (int idx = 0; idx < m_editions_count; ++idx) {
    m_editions[idx].ShallowCopy(editions[idx]);
  }

  delete[] m_editions;
  m_editions = editions;

  m_editions_size = size;
  return true;
}